

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_control_mobile.cc
# Opt level: O3

int32_t WebRtcAecm_Process(void *aecmInst,int16_t *nearendNoisy,int16_t *nearendClean,int16_t *out,
                          size_t nrOfSamples,int16_t msInSndCardBuf)

{
  RingBuffer *self;
  uint uVar1;
  short sVar2;
  ulong uVar3;
  size_t sVar4;
  short sVar5;
  int16_t *nearendClean_00;
  undefined2 uVar6;
  int32_t iVar7;
  short sVar8;
  int iVar9;
  uint uVar10;
  int16_t iVar11;
  long lVar12;
  double dVar13;
  int16_t *farend_ptr;
  int16_t farend [80];
  int16_t *local_100;
  int32_t local_f4;
  int16_t *local_f0;
  int *local_e8;
  ulong local_e0;
  int16_t local_d8 [84];
  
  if (aecmInst == (void *)0x0) {
    return -1;
  }
  if (out == (int16_t *)0x0 || nearendNoisy == (int16_t *)0x0) {
    return 0x2ee3;
  }
  if (*(short *)((long)aecmInst + 0x150) != 0x2a) {
    return 0x2ee2;
  }
  if ((nrOfSamples != 0xa0) && (nrOfSamples != 0x50)) {
    return 0x2ee4;
  }
  iVar11 = msInSndCardBuf;
  if (499 < msInSndCardBuf) {
    iVar11 = 500;
  }
  iVar7 = 0x2f44;
  if ((ushort)msInSndCardBuf < 0x1f5) {
    iVar7 = 0;
  }
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  *(int16_t *)((long)aecmInst + 0x15a) = iVar11 + 10;
  local_e0 = (ulong)(((uint)nrOfSamples & 0xff) / 0x50);
  uVar3 = local_e0 / (ulong)(long)*(short *)(*(long *)((long)aecmInst + 0x180) + 0x238);
  if (*(int *)((long)aecmInst + 0x164) == 0) {
    lVar12 = 0;
    uVar3 = 0;
    local_f4 = iVar7;
    local_f0 = out;
    local_e8 = (int *)aecmInst;
    do {
      local_100 = (int16_t *)0x0;
      sVar4 = WebRtc_available_read(*(RingBuffer **)((long)aecmInst + 0x178));
      if ((short)sVar4 < 0x50) {
        memcpy(local_d8,(void *)((long)aecmInst + lVar12 + 0x10),0xa0);
        aecmInst = local_e8;
        local_100 = local_d8;
      }
      else {
        WebRtc_ReadBuffer(*(RingBuffer **)((long)aecmInst + 0x178),&local_100,local_d8,0x50);
        memcpy((void *)((long)aecmInst + lVar12 + 0x10),local_100,0xa0);
      }
      if (uVar3 == 1) {
        if (*aecmInst == 16000) goto LAB_0016a8c5;
      }
      else if ((uVar3 == 0) && (*aecmInst == 8000)) {
LAB_0016a8c5:
        sVar8 = *(short *)((long)aecmInst + 0x15a);
        sVar4 = WebRtc_available_read(*(RingBuffer **)((long)aecmInst + 0x178));
        sVar8 = sVar8 * *(short *)(*(long *)((long)aecmInst + 0x180) + 0x238) * 8 - (short)sVar4;
        if (sVar8 < 0x50) {
          WebRtc_MoveReadPtr(*(RingBuffer **)((long)aecmInst + 0x178),0x50);
          sVar8 = sVar8 + 0x50;
        }
        iVar9 = sVar8 * 2 + (short)*(int *)((long)aecmInst + 0x15c) * 8;
        sVar8 = (short)(uint)((ulong)((long)iVar9 * 0x66666667) >> 0x22) - (short)(iVar9 >> 0x1f);
        if (iVar9 < -9) {
          sVar8 = 0;
        }
        *(short *)((long)aecmInst + 0x15c) = sVar8;
        sVar5 = sVar8 - (short)*(int *)((long)aecmInst + 0xc);
        out = local_f0;
        if (sVar5 < 0xe1) {
          if (((*(int *)((long)aecmInst + 0xc) < 1) || (0x5f < sVar5)) ||
             (0xe0 < (short)*(int *)((long)aecmInst + 0x170))) goto LAB_0016a97f;
        }
        else if ((short)*(int *)((long)aecmInst + 0x170) < 0x60) {
LAB_0016a97f:
          *(int *)((long)aecmInst + 0x160) = 0;
          *(short *)((long)aecmInst + 0x170) = sVar5;
          goto LAB_0016a9c1;
        }
        iVar9 = *(int *)((long)aecmInst + 0x160);
        *(int *)((long)aecmInst + 0x160) = iVar9 + 1;
        *(short *)((long)aecmInst + 0x170) = sVar5;
        if (0x18 < iVar9) {
          if (sVar8 < 0xa1) {
            iVar9 = 0;
          }
          else {
            iVar9 = sVar8 + -0xa0;
          }
          *(int *)((long)aecmInst + 0xc) = iVar9;
        }
      }
LAB_0016a9c1:
      nearendClean_00 = (int16_t *)((long)nearendClean + lVar12);
      if (nearendClean == (int16_t *)0x0) {
        nearendClean_00 = (int16_t *)0x0;
      }
      iVar9 = WebRtcAecm_ProcessFrame
                        (*(AecmCore **)((long)aecmInst + 0x180),local_100,
                         (int16_t *)((long)nearendNoisy + lVar12),nearendClean_00,
                         (int16_t *)((long)out + lVar12));
      if (iVar9 == -1) {
        return -1;
      }
      uVar3 = uVar3 + 1;
      lVar12 = lVar12 + 0xa0;
      if (local_e0 == uVar3) {
        return local_f4;
      }
    } while( true );
  }
  if (nearendClean == (int16_t *)0x0) {
    nearendClean = nearendNoisy;
    if (out != nearendNoisy) goto LAB_0016a7a0;
  }
  else if (out != nearendClean) {
LAB_0016a7a0:
    memcpy(out,nearendClean,nrOfSamples * 2);
  }
  sVar4 = WebRtc_available_read(*(RingBuffer **)((long)aecmInst + 0x178));
  if (*(int *)((long)aecmInst + 0x168) != 0) {
    sVar8 = (short)*(undefined4 *)((long)aecmInst + 0x158) + 1;
    *(short *)((long)aecmInst + 0x158) = sVar8;
    if (*(short *)((long)aecmInst + 0x152) == 0) {
      sVar5 = *(short *)((long)aecmInst + 0x15a);
      *(short *)((long)aecmInst + 0x156) = sVar5;
      *(undefined2 *)((long)aecmInst + 0x154) = 0;
      sVar2 = sVar5;
    }
    else {
      sVar5 = *(short *)((long)aecmInst + 0x156);
      sVar2 = *(short *)((long)aecmInst + 0x15a);
    }
    iVar9 = (int)sVar2;
    uVar10 = sVar5 - iVar9;
    uVar1 = -uVar10;
    if (0 < (int)uVar10) {
      uVar1 = uVar10;
    }
    dVar13 = (double)iVar9 * 0.2;
    if (dVar13 <= 8.0) {
      dVar13 = 8.0;
    }
    if (dVar13 <= (double)(uVar1 & 0xffff)) {
      sVar5 = 0;
    }
    else {
      *(short *)((long)aecmInst + 0x154) = *(short *)((long)aecmInst + 0x154) + sVar2;
      sVar5 = *(short *)((long)aecmInst + 0x152) + 1;
    }
    *(short *)((long)aecmInst + 0x152) = sVar5;
    if ((long)sVar5 * uVar3 < 6) {
      if (uVar3 * (long)sVar8 < 0x33) {
        return iVar7;
      }
    }
    else {
      lVar12 = (long)((int)*(short *)(*(long *)((long)aecmInst + 0x180) + 0x238) *
                      (int)*(short *)((long)aecmInst + 0x154) * 3) / (long)(sVar5 * 0x28);
      uVar6 = 0x32;
      if ((int)lVar12 < 0x32) {
        uVar6 = (undefined2)lVar12;
      }
      *(undefined2 *)((long)aecmInst + 8) = uVar6;
      *(undefined4 *)((long)aecmInst + 0x168) = 0;
      if (uVar3 * (long)sVar8 < 0x33) goto LAB_0016ab4e;
    }
    iVar9 = iVar9 * *(short *)(*(long *)((long)aecmInst + 0x180) + 0x238) * 3;
    sVar8 = 0x32;
    if (iVar9 < 2000) {
      sVar8 = (short)(uint)((ulong)((long)iVar9 * 0x66666667) >> 0x24) - (short)(iVar9 >> 0x1f);
    }
    *(short *)((long)aecmInst + 8) = sVar8;
    *(undefined4 *)((long)aecmInst + 0x168) = 0;
  }
LAB_0016ab4e:
  sVar8 = (short)sVar4 / 0x50;
  if (sVar8 != *(short *)((long)aecmInst + 8)) {
    if (sVar8 <= *(short *)((long)aecmInst + 8)) {
      return iVar7;
    }
    self = *(RingBuffer **)((long)aecmInst + 0x178);
    sVar4 = WebRtc_available_read(self);
    WebRtc_MoveReadPtr(self,(int)sVar4 + *(short *)((long)aecmInst + 8) * -0x50);
  }
  *(undefined4 *)((long)aecmInst + 0x164) = 0;
  return iVar7;
}

Assistant:

int32_t WebRtcAecm_Process(void *aecmInst, const int16_t *nearendNoisy,
                           const int16_t *nearendClean, int16_t *out,
                           size_t nrOfSamples, int16_t msInSndCardBuf)
{
    AecMobile* aecm = static_cast<AecMobile*>(aecmInst);
    int32_t retVal = 0;
    size_t i;
    short nmbrOfFilledBuffers;
    size_t nBlocks10ms;
    size_t nFrames;
#ifdef AEC_DEBUG
    short msInAECBuf;
#endif

    if (aecm == NULL)
    {
        return -1;
    }

    if (nearendNoisy == NULL)
    {
        return AECM_NULL_POINTER_ERROR;
    }

    if (out == NULL)
    {
        return AECM_NULL_POINTER_ERROR;
    }

    if (aecm->initFlag != kInitCheck)
    {
        return AECM_UNINITIALIZED_ERROR;
    }

    if (nrOfSamples != 80 && nrOfSamples != 160)
    {
        return AECM_BAD_PARAMETER_ERROR;
    }

    if (msInSndCardBuf < 0)
    {
        msInSndCardBuf = 0;
        retVal = AECM_BAD_PARAMETER_WARNING;
    } else if (msInSndCardBuf > 500)
    {
        msInSndCardBuf = 500;
        retVal = AECM_BAD_PARAMETER_WARNING;
    }
    msInSndCardBuf += 10;
    aecm->msInSndCardBuf = msInSndCardBuf;

    nFrames = nrOfSamples / FRAME_LEN;
    nBlocks10ms = nFrames / aecm->aecmCore->mult;

    if (aecm->ECstartup)
    {
        if (nearendClean == NULL)
        {
            if (out != nearendNoisy)
            {
                memcpy(out, nearendNoisy, sizeof(short) * nrOfSamples);
            }
        } else if (out != nearendClean)
        {
            memcpy(out, nearendClean, sizeof(short) * nrOfSamples);
        }

        nmbrOfFilledBuffers =
            (short) WebRtc_available_read(aecm->farendBuf) / FRAME_LEN;
        // The AECM is in the start up mode
        // AECM is disabled until the soundcard buffer and farend buffers are OK

        // Mechanism to ensure that the soundcard buffer is reasonably stable.
        if (aecm->checkBuffSize)
        {
            aecm->checkBufSizeCtr++;
            // Before we fill up the far end buffer we require the amount of data on the
            // sound card to be stable (+/-8 ms) compared to the first value. This
            // comparison is made during the following 4 consecutive frames. If it seems
            // to be stable then we start to fill up the far end buffer.

            if (aecm->counter == 0)
            {
                aecm->firstVal = aecm->msInSndCardBuf;
                aecm->sum = 0;
            }

            if (abs(aecm->firstVal - aecm->msInSndCardBuf)
                    < WEBRTC_SPL_MAX(0.2 * aecm->msInSndCardBuf, kSampMsNb))
            {
                aecm->sum += aecm->msInSndCardBuf;
                aecm->counter++;
            } else
            {
                aecm->counter = 0;
            }

            if (aecm->counter * nBlocks10ms >= 6)
            {
                // The farend buffer size is determined in blocks of 80 samples
                // Use 75% of the average value of the soundcard buffer
                aecm->bufSizeStart
                        = WEBRTC_SPL_MIN((3 * aecm->sum
                                        * aecm->aecmCore->mult) / (aecm->counter * 40), BUF_SIZE_FRAMES);
                // buffersize has now been determined
                aecm->checkBuffSize = 0;
            }

            if (aecm->checkBufSizeCtr * nBlocks10ms > 50)
            {
                // for really bad sound cards, don't disable echocanceller for more than 0.5 sec
                aecm->bufSizeStart = WEBRTC_SPL_MIN((3 * aecm->msInSndCardBuf
                                * aecm->aecmCore->mult) / 40, BUF_SIZE_FRAMES);
                aecm->checkBuffSize = 0;
            }
        }

        // if checkBuffSize changed in the if-statement above
        if (!aecm->checkBuffSize)
        {
            // soundcard buffer is now reasonably stable
            // When the far end buffer is filled with approximately the same amount of
            // data as the amount on the sound card we end the start up phase and start
            // to cancel echoes.

            if (nmbrOfFilledBuffers == aecm->bufSizeStart)
            {
                aecm->ECstartup = 0; // Enable the AECM
            } else if (nmbrOfFilledBuffers > aecm->bufSizeStart)
            {
                WebRtc_MoveReadPtr(aecm->farendBuf,
                                   (int) WebRtc_available_read(aecm->farendBuf)
                                   - (int) aecm->bufSizeStart * FRAME_LEN);
                aecm->ECstartup = 0;
            }
        }

    } else
    {
        // AECM is enabled

        // Note only 1 block supported for nb and 2 blocks for wb
        for (i = 0; i < nFrames; i++)
        {
            int16_t farend[FRAME_LEN];
            const int16_t* farend_ptr = NULL;

            nmbrOfFilledBuffers =
                (short) WebRtc_available_read(aecm->farendBuf) / FRAME_LEN;

            // Check that there is data in the far end buffer
            if (nmbrOfFilledBuffers > 0)
            {
                // Get the next 80 samples from the farend buffer
                WebRtc_ReadBuffer(aecm->farendBuf, (void**) &farend_ptr, farend,
                                  FRAME_LEN);

                // Always store the last frame for use when we run out of data
                memcpy(&(aecm->farendOld[i][0]), farend_ptr,
                       FRAME_LEN * sizeof(short));
            } else
            {
                // We have no data so we use the last played frame
                memcpy(farend, &(aecm->farendOld[i][0]), FRAME_LEN * sizeof(short));
                farend_ptr = farend;
            }

            // Call buffer delay estimator when all data is extracted,
            // i,e. i = 0 for NB and i = 1 for WB
            if ((i == 0 && aecm->sampFreq == 8000) || (i == 1 && aecm->sampFreq == 16000))
            {
                WebRtcAecm_EstBufDelay(aecm, aecm->msInSndCardBuf);
            }

            // Call the AECM
            /*WebRtcAecm_ProcessFrame(aecm->aecmCore, farend, &nearend[FRAME_LEN * i],
             &out[FRAME_LEN * i], aecm->knownDelay);*/
            if (WebRtcAecm_ProcessFrame(aecm->aecmCore,
                                        farend_ptr,
                                        &nearendNoisy[FRAME_LEN * i],
                                        (nearendClean
                                         ? &nearendClean[FRAME_LEN * i]
                                         : NULL),
                                        &out[FRAME_LEN * i]) == -1)
                return -1;
        }
    }

#ifdef AEC_DEBUG
    msInAECBuf = (short) WebRtc_available_read(aecm->farendBuf) /
        (kSampMsNb * aecm->aecmCore->mult);
    fwrite(&msInAECBuf, 2, 1, aecm->bufFile);
    fwrite(&(aecm->knownDelay), sizeof(aecm->knownDelay), 1, aecm->delayFile);
#endif

    return retVal;
}